

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

int fmt::v6::internal::format_float<long_double>
              (longdouble value,int precision,float_specs specs,buffer<char> *buf)

{
  fp y;
  fp x;
  fp x_00;
  float_specs specs_00;
  float_specs specs_01;
  float_specs specs_02;
  int iVar1;
  uint64_t uVar2;
  significand_type sVar3;
  buffer<char> *buf_00;
  char *pcVar4;
  ulong uVar5;
  buffer<char> *in_RDX;
  undefined8 extraout_RDX;
  undefined8 in_RSI;
  uint uVar6;
  int in_EDI;
  bool bVar7;
  fp fVar8;
  fp value_00;
  fp value_01;
  longdouble in_stack_00000008;
  int num_digits;
  fixed_handler handler_1;
  fp cached_pow_1;
  fp normalized;
  result result;
  grisu_shortest_handler handler;
  fp cached_pow;
  boundaries boundaries;
  fp fp_value;
  int cached_exp10;
  int min_exp;
  int exp;
  bool fixed;
  char digit_1;
  uint64_t remainder;
  anon_class_16_2_fdf32556 divmod_integral;
  uint32_t digit;
  result result_1;
  uint64_t fractional;
  uint32_t integral;
  fp one;
  char digit_3;
  uint64_t remainder_1;
  anon_class_16_2_fdf32556 divmod_integral_1;
  uint32_t digit_2;
  result result_2;
  uint64_t fractional_1;
  uint32_t integral_1;
  fp one_1;
  undefined4 in_stack_fffffffffffffcc8;
  undefined4 uVar9;
  undefined4 in_stack_fffffffffffffccc;
  undefined4 uVar10;
  undefined2 in_stack_fffffffffffffcd0;
  undefined2 uVar11;
  undefined6 in_stack_fffffffffffffcd2;
  undefined2 in_stack_fffffffffffffcd8;
  undefined2 in_stack_fffffffffffffcda;
  int in_stack_fffffffffffffcdc;
  undefined4 in_stack_fffffffffffffce0;
  int in_stack_fffffffffffffce4;
  undefined7 in_stack_fffffffffffffce8;
  undefined1 in_stack_fffffffffffffcef;
  uint64_t in_stack_fffffffffffffcf0;
  fixed_handler *in_stack_fffffffffffffcf8;
  undefined8 in_stack_fffffffffffffd00;
  fixed_handler *in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd14;
  grisu_shortest_handler *in_stack_fffffffffffffd18;
  undefined8 in_stack_fffffffffffffd20;
  undefined2 in_stack_fffffffffffffd28;
  fp *in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd44;
  undefined2 in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd54;
  buffer<char> *in_stack_fffffffffffffda0;
  int in_stack_fffffffffffffdac;
  undefined8 in_stack_fffffffffffffdb0;
  undefined2 in_stack_fffffffffffffdb8;
  undefined2 uVar12;
  internal *local_240;
  uint local_238;
  int in_stack_fffffffffffffdcc;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 uVar13;
  undefined4 uStack_22c;
  fp local_218;
  result local_204;
  grisu_shortest_handler local_200;
  significand_type local_1e8;
  int local_1e0;
  significand_type local_1d8;
  undefined8 uStack_1d0;
  significand_type local_1c8;
  undefined8 uStack_1c0;
  significand_type local_1b8;
  int local_1b0;
  significand_type local_1a8;
  int local_1a0;
  uint64_t local_198;
  int iStack_190;
  undefined4 uStack_18c;
  significand_type local_188;
  int local_180;
  internal *local_178;
  significand_type local_160;
  int local_158;
  boundaries local_150;
  fp local_140;
  int local_130;
  undefined4 local_12c;
  int local_128 [3];
  undefined1 local_11b;
  undefined1 local_11a;
  byte local_119;
  buffer<char> *local_118;
  int local_10c;
  longdouble local_108;
  uint uStack_ec;
  int local_e8;
  char local_e1;
  long local_e0;
  anon_class_16_2_fdf32556 local_d8;
  uint32_t local_c8;
  result local_c4;
  ulong local_c0;
  uint32_t local_b4;
  fp local_b0;
  grisu_shortest_handler *local_a0;
  int *local_98;
  long local_90;
  ulong local_88;
  int local_80;
  result local_78;
  char local_71;
  long local_70;
  anon_class_16_2_fdf32556 local_68;
  uint32_t local_58;
  result local_54;
  ulong local_50;
  uint32_t local_44;
  fp local_40;
  undefined1 *local_30;
  int *local_28;
  int *in_stack_ffffffffffffffe0;
  buffer<char> *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  undefined6 in_stack_fffffffffffffff4;
  result local_4;
  
  uVar6 = (uint)((ulong)in_RSI >> 0x20);
  local_108 = in_stack_00000008;
  uStack_ec._0_1_ = (char)((ulong)in_RSI >> 0x20);
  local_119 = (char)uStack_ec == '\x02';
  local_118 = in_RDX;
  if ((longdouble)0 < in_stack_00000008) {
    if ((uVar6 >> 0x14 & 1) == 0) {
      specs_00._4_4_ = in_stack_fffffffffffffdd0;
      specs_00.precision = in_stack_fffffffffffffdcc;
      local_e8 = snprintf_float<long_double>
                           ((longdouble)
                            CONCAT28(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
                            in_stack_fffffffffffffdac,specs_00,in_stack_fffffffffffffda0);
    }
    else {
      local_128[0] = 0;
      local_12c = 0xffffffc4;
      local_130 = 0;
      if (in_EDI < 0) {
        uStack_ec = uVar6;
        fp::fp(&local_140);
        uVar11 = (undefined2)((unkuint10)local_108 >> 0x40);
        uVar9 = SUB104(local_108,0);
        uVar10 = (undefined4)((unkuint10)local_108 >> 0x20);
        if ((uStack_ec >> 0x13 & 1) == 0) {
          local_150 = fp::assign_with_boundaries<long_double>
                                (in_stack_fffffffffffffd30,
                                 (longdouble)
                                 CONCAT28(in_stack_fffffffffffffd28,in_stack_fffffffffffffd20));
          uVar2 = local_150.upper;
        }
        else {
          local_150 = fp::assign_float_with_boundaries<long_double>
                                ((fp *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50)
                                 ,(longdouble)
                                  CONCAT28(in_stack_fffffffffffffd48,
                                           CONCAT44(in_stack_fffffffffffffd44,
                                                    in_stack_fffffffffffffd40)));
          uVar2 = local_150.upper;
        }
        local_178 = (internal *)local_140.f;
        value_00._8_8_ = uVar2;
        value_00.f = (ulong)(uint)local_140.e;
        fVar8 = normalize<0>((internal *)local_140.f,value_00);
        local_188 = fVar8.f;
        local_180 = fVar8.e;
        local_160 = local_188;
        local_158 = local_180;
        local_140.f = local_188;
        local_140.e = local_180;
        fVar8 = get_cached_power(in_stack_fffffffffffffce4,
                                 (int *)CONCAT44(in_stack_fffffffffffffcdc,
                                                 CONCAT22(in_stack_fffffffffffffcda,
                                                          in_stack_fffffffffffffcd8)));
        local_1d8 = fVar8.f;
        local_1a0 = fVar8.e;
        uStack_1c0 = CONCAT44(local_140._12_4_,local_140.e);
        local_1c8 = local_140.f;
        uStack_1d0 = CONCAT44(uStack_18c,local_1a0);
        x.f._2_2_ = in_stack_fffffffffffffcda;
        x.f._0_2_ = in_stack_fffffffffffffcd8;
        x.f._4_4_ = in_stack_fffffffffffffcdc;
        x.e = in_stack_fffffffffffffce0;
        x._12_4_ = in_stack_fffffffffffffce4;
        y.f._4_4_ = uVar10;
        y.f._0_4_ = uVar9;
        y.e._0_2_ = uVar11;
        y._10_6_ = in_stack_fffffffffffffcd2;
        local_1a8 = local_1d8;
        local_198 = local_1d8;
        iStack_190 = local_1a0;
        fVar8 = operator*(x,y);
        local_1e8 = fVar8.f;
        local_1e0 = fVar8.e;
        local_1b8 = local_1e8;
        local_1b0 = local_1e0;
        local_140.f = local_1e8;
        local_140.e = local_1e0;
        uVar2 = multiply(local_150.lower,local_198);
        local_150.lower = uVar2;
        uVar2 = multiply(local_150.upper,local_198);
        local_150.lower = local_150.lower + -1;
        local_150.upper = uVar2 + 1;
        local_200.buf = buffer<char>::data(local_118);
        local_200.size = 0;
        local_200.diff = local_150.upper - local_140.f;
        fp::fp(&local_218,local_150.upper,local_140.e);
        local_90 = local_150.upper - local_150.lower;
        local_88 = local_218.f;
        local_80 = local_218.e;
        local_98 = local_128;
        local_a0 = &local_200;
        fp::fp(&local_b0,1L << (-(char)local_218.e & 0x3fU),local_218.e);
        local_b4 = (uint32_t)(local_88 >> (-(char)local_b0.e & 0x3fU));
        local_c0 = local_88 & local_b0.f - 1;
        iVar1 = grisu_count_digits(local_b4);
        *local_98 = iVar1;
        local_78 = grisu_shortest_handler::on_start
                             (local_a0,*(long *)(basic_data<void>::powers_of_10_64 +
                                                (long)(*local_98 + -1) * 8) <<
                                       (-(char)local_b0.e & 0x3fU),local_88 / 10,local_90 * 10,
                              local_98);
        if (local_78 == more) {
          do {
            local_c4 = 0;
            local_c8 = 0;
            local_d8.digit = &local_c8;
            local_d8.integral = &local_b4;
            uVar5 = (ulong)(*local_98 - 1);
            switch(uVar5) {
            case 0:
              local_c8 = local_b4;
              local_b4 = 0;
              break;
            case 1:
              grisu_gen_digits<fmt::v6::internal::grisu_shortest_handler>::anon_class_16_2_fdf32556
              ::operator()(&local_d8,10);
              break;
            case 2:
              grisu_gen_digits<fmt::v6::internal::grisu_shortest_handler>::anon_class_16_2_fdf32556
              ::operator()(&local_d8,100);
              break;
            case 3:
              grisu_gen_digits<fmt::v6::internal::grisu_shortest_handler>::anon_class_16_2_fdf32556
              ::operator()(&local_d8,1000);
              break;
            case 4:
              grisu_gen_digits<fmt::v6::internal::grisu_shortest_handler>::anon_class_16_2_fdf32556
              ::operator()(&local_d8,10000);
              break;
            case 5:
              grisu_gen_digits<fmt::v6::internal::grisu_shortest_handler>::anon_class_16_2_fdf32556
              ::operator()(&local_d8,100000);
              break;
            case 6:
              grisu_gen_digits<fmt::v6::internal::grisu_shortest_handler>::anon_class_16_2_fdf32556
              ::operator()(&local_d8,1000000);
              break;
            case 7:
              grisu_gen_digits<fmt::v6::internal::grisu_shortest_handler>::anon_class_16_2_fdf32556
              ::operator()(&local_d8,10000000);
              break;
            case 8:
              grisu_gen_digits<fmt::v6::internal::grisu_shortest_handler>::anon_class_16_2_fdf32556
              ::operator()(&local_d8,100000000);
              break;
            case 9:
              grisu_gen_digits<fmt::v6::internal::grisu_shortest_handler>::anon_class_16_2_fdf32556
              ::operator()(&local_d8,1000000000);
            }
            *local_98 = *local_98 + -1;
            local_e0 = ((ulong)local_b4 << (-(char)local_b0.e & 0x3fU)) + local_c0;
            uVar9 = 1;
            local_78 = grisu_shortest_handler::on_digit
                                 (in_stack_fffffffffffffd18,
                                  (char)((uint)in_stack_fffffffffffffd14 >> 0x18),
                                  (uint64_t)in_stack_fffffffffffffd08,uVar5,
                                  (uint64_t)in_stack_fffffffffffffcf8,
                                  (int)(in_stack_fffffffffffffcf0 >> 0x20),
                                  SUB81(in_stack_fffffffffffffcf0 >> 0x18,0));
            if (local_78 != more) goto LAB_001f1666;
          } while (0 < *local_98);
          do {
            local_c4 = 0;
            local_90 = local_90 * 10;
            local_e1 = (char)(local_c0 * 10 >> (-(char)local_b0.e & 0x3fU)) + '0';
            local_c0 = local_b0.f - 1 & local_c0 * 10;
            *local_98 = *local_98 + -1;
            uVar9 = 0;
            local_78 = grisu_shortest_handler::on_digit
                                 (in_stack_fffffffffffffd18,
                                  (char)((uint)in_stack_fffffffffffffd14 >> 0x18),
                                  (uint64_t)in_stack_fffffffffffffd08,uVar5,
                                  (uint64_t)in_stack_fffffffffffffcf8,
                                  (int)(in_stack_fffffffffffffcf0 >> 0x20),
                                  SUB81(in_stack_fffffffffffffcf0 >> 0x18,0));
          } while (local_78 == more);
        }
LAB_001f1666:
        local_204 = local_78;
        local_c4 = local_78;
        if (local_78 == error) {
          local_128[0] = (local_200.size - local_130) + -1 + local_128[0];
          fallback_format<long_double>
                    ((longdouble)CONCAT64(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                     in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
          return local_128[0];
        }
        to_unsigned<int>(local_200.size);
        buffer<char>::resize
                  ((buffer<char> *)CONCAT62(in_stack_fffffffffffffcd2,uVar11),CONCAT44(uVar10,uVar9)
                  );
      }
      else {
        if (0x11 < in_EDI) {
          specs_01._4_4_ = in_stack_fffffffffffffdd0;
          specs_01.precision = in_stack_fffffffffffffdcc;
          iVar1 = snprintf_float<long_double>
                            ((longdouble)
                             CONCAT28(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
                             in_stack_fffffffffffffdac,specs_01,in_stack_fffffffffffffda0);
          return iVar1;
        }
        uVar9 = SUB104(in_stack_00000008,0);
        uVar10 = (undefined4)((unkuint10)in_stack_00000008 >> 0x20);
        uVar11 = (undefined2)((unkuint10)in_stack_00000008 >> 0x40);
        fp::fp<long_double>((fp *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                            (longdouble)
                            CONCAT28(in_stack_fffffffffffffcd8,
                                     CONCAT62(in_stack_fffffffffffffcd2,uVar11)));
        value_01.f = (ulong)local_238;
        value_01._8_8_ = extraout_RDX;
        fVar8 = normalize<0>(local_240,value_01);
        sVar3 = fVar8.f;
        uVar12 = (undefined2)fVar8.e;
        fVar8 = get_cached_power(in_stack_fffffffffffffce4,
                                 (int *)CONCAT44(in_stack_fffffffffffffcdc,
                                                 CONCAT22(in_stack_fffffffffffffcda,
                                                          in_stack_fffffffffffffcd8)));
        buf_00 = (buffer<char> *)fVar8.f;
        x_00.f._2_2_ = in_stack_fffffffffffffcda;
        x_00.f._0_2_ = in_stack_fffffffffffffcd8;
        x_00.f._4_4_ = in_stack_fffffffffffffcdc;
        x_00.e = in_stack_fffffffffffffce0;
        x_00._12_4_ = in_stack_fffffffffffffce4;
        fVar8.f._4_4_ = uVar10;
        fVar8.f._0_4_ = uVar9;
        fVar8.e._0_2_ = uVar11;
        fVar8._10_6_ = in_stack_fffffffffffffcd2;
        fVar8 = operator*(x_00,fVar8);
        uVar13 = (undefined4)fVar8.f;
        uStack_22c = fVar8.f._4_4_;
        buffer<char>::data(local_118);
        uVar5 = CONCAT44(uStack_22c,uVar13);
        local_28 = local_128;
        local_30 = &stack0xfffffffffffffd30;
        fp::fp(&local_40,1L << (-(char)fVar8.e & 0x3fU),fVar8.e);
        local_44 = (uint32_t)(uVar5 >> (-(char)local_40.e & 0x3fU));
        local_50 = uVar5 & local_40.f - 1;
        iVar1 = grisu_count_digits(local_44);
        *local_28 = iVar1;
        local_4 = fixed_handler::on_start
                            (in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,
                             CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
                             CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                             (int *)CONCAT44(in_stack_fffffffffffffcdc,
                                             CONCAT22(in_stack_fffffffffffffcda,
                                                      in_stack_fffffffffffffcd8)));
        if (local_4 == more) {
          do {
            local_54 = 0;
            local_58 = 0;
            local_68.digit = &local_58;
            local_68.integral = &local_44;
            uVar5 = (ulong)(*local_28 - 1);
            switch(uVar5) {
            case 0:
              local_58 = local_44;
              local_44 = 0;
              break;
            case 1:
              grisu_gen_digits<fmt::v6::internal::fixed_handler>::anon_class_16_2_fdf32556::
              operator()(&local_68,10);
              break;
            case 2:
              grisu_gen_digits<fmt::v6::internal::fixed_handler>::anon_class_16_2_fdf32556::
              operator()(&local_68,100);
              break;
            case 3:
              grisu_gen_digits<fmt::v6::internal::fixed_handler>::anon_class_16_2_fdf32556::
              operator()(&local_68,1000);
              break;
            case 4:
              grisu_gen_digits<fmt::v6::internal::fixed_handler>::anon_class_16_2_fdf32556::
              operator()(&local_68,10000);
              break;
            case 5:
              grisu_gen_digits<fmt::v6::internal::fixed_handler>::anon_class_16_2_fdf32556::
              operator()(&local_68,100000);
              break;
            case 6:
              grisu_gen_digits<fmt::v6::internal::fixed_handler>::anon_class_16_2_fdf32556::
              operator()(&local_68,1000000);
              break;
            case 7:
              grisu_gen_digits<fmt::v6::internal::fixed_handler>::anon_class_16_2_fdf32556::
              operator()(&local_68,10000000);
              break;
            case 8:
              grisu_gen_digits<fmt::v6::internal::fixed_handler>::anon_class_16_2_fdf32556::
              operator()(&local_68,100000000);
              break;
            case 9:
              grisu_gen_digits<fmt::v6::internal::fixed_handler>::anon_class_16_2_fdf32556::
              operator()(&local_68,1000000000);
            }
            *local_28 = *local_28 + -1;
            local_70 = ((ulong)local_44 << (-(char)local_40.e & 0x3fU)) + local_50;
            uVar9 = 1;
            local_4 = fixed_handler::on_digit
                                (in_stack_fffffffffffffd08,
                                 (char)((ulong)in_stack_fffffffffffffd00 >> 0x38),
                                 (uint64_t)in_stack_fffffffffffffcf8,uVar5,
                                 CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
                                 in_stack_fffffffffffffce4,
                                 SUB41((uint)in_stack_fffffffffffffce0 >> 0x18,0));
            if (local_4 != more) goto LAB_001f1cfa;
          } while (0 < *local_28);
          do {
            local_54 = 0;
            local_71 = (char)(local_50 * 10 >> (-(char)local_40.e & 0x3fU)) + '0';
            local_50 = local_40.f - 1 & local_50 * 10;
            *local_28 = *local_28 + -1;
            uVar9 = 0;
            local_4 = fixed_handler::on_digit
                                (in_stack_fffffffffffffd08,
                                 (char)((ulong)in_stack_fffffffffffffd00 >> 0x38),
                                 (uint64_t)in_stack_fffffffffffffcf8,uVar5,
                                 CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
                                 in_stack_fffffffffffffce4,
                                 SUB41((uint)in_stack_fffffffffffffce0 >> 0x18,0));
          } while (local_4 == more);
        }
LAB_001f1cfa:
        local_54 = local_4;
        if (local_4 == error) {
          specs_02._4_4_ = uVar13;
          specs_02.precision = in_stack_fffffffffffffdcc;
          iVar1 = snprintf_float<long_double>
                            ((longdouble)CONCAT28(uVar12,sVar3),in_stack_fffffffffffffdac,specs_02,
                             buf_00);
          return iVar1;
        }
        iVar1 = 0;
        if ((local_119 & 1) == 0) {
          while( true ) {
            bVar7 = false;
            if (0 < iVar1) {
              pcVar4 = buffer<char>::operator[]<int>(local_118,iVar1 + -1);
              bVar7 = *pcVar4 == '0';
            }
            if (!bVar7) break;
            iVar1 = iVar1 + -1;
            local_128[0] = local_128[0] + 1;
          }
        }
        to_unsigned<int>(iVar1);
        buffer<char>::resize
                  ((buffer<char> *)CONCAT62(in_stack_fffffffffffffcd2,uVar11),CONCAT44(uVar10,uVar9)
                  );
      }
      local_e8 = local_128[0] - local_130;
    }
  }
  else if ((in_EDI < 1) || (!(bool)local_119)) {
    local_11a = 0x30;
    buffer<char>::push_back
              ((buffer<char> *)CONCAT62(in_stack_fffffffffffffcd2,in_stack_fffffffffffffcd0),
               (char *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
    local_e8 = 0;
  }
  else {
    local_10c = in_EDI;
    to_unsigned<int>(in_EDI);
    buffer<char>::resize
              ((buffer<char> *)CONCAT62(in_stack_fffffffffffffcd2,in_stack_fffffffffffffcd0),
               CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
    buffer<char>::data(local_118);
    local_11b = 0x30;
    std::uninitialized_fill_n<char*,int,char>
              ((char *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
               in_stack_fffffffffffffcdc,
               (char *)CONCAT62(in_stack_fffffffffffffcd2,in_stack_fffffffffffffcd0));
    local_e8 = -local_10c;
  }
  return local_e8;
}

Assistant:

int format_float(T value, int precision, float_specs specs, buffer<char>& buf) {
  static_assert(!std::is_same<T, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.resize(to_unsigned(precision));
    std::uninitialized_fill_n(buf.data(), precision, '0');
    return -precision;
  }

  if (!specs.use_grisu) return snprintf_float(value, precision, specs, buf);

  int exp = 0;
  const int min_exp = -60;  // alpha in Grisu.
  int cached_exp10 = 0;     // K in Grisu.
  if (precision < 0) {
    fp fp_value;
    auto boundaries = specs.binary32
                          ? fp_value.assign_float_with_boundaries(value)
                          : fp_value.assign_with_boundaries(value);
    fp_value = normalize(fp_value);
    // Find a cached power of 10 such that multiplying value by it will bring
    // the exponent in the range [min_exp, -32].
    const fp cached_pow = get_cached_power(
        min_exp - (fp_value.e + fp::significand_size), cached_exp10);
    // Multiply value and boundaries by the cached power of 10.
    fp_value = fp_value * cached_pow;
    boundaries.lower = multiply(boundaries.lower, cached_pow.f);
    boundaries.upper = multiply(boundaries.upper, cached_pow.f);
    assert(min_exp <= fp_value.e && fp_value.e <= -32);
    --boundaries.lower;  // \tilde{M}^- - 1 ulp -> M^-_{\downarrow}.
    ++boundaries.upper;  // \tilde{M}^+ + 1 ulp -> M^+_{\uparrow}.
    // Numbers outside of (lower, upper) definitely do not round to value.
    grisu_shortest_handler handler{buf.data(), 0,
                                   boundaries.upper - fp_value.f};
    auto result =
        grisu_gen_digits(fp(boundaries.upper, fp_value.e),
                         boundaries.upper - boundaries.lower, exp, handler);
    if (result == digits::error) {
      exp += handler.size - cached_exp10 - 1;
      fallback_format(value, buf, exp);
      return exp;
    }
    buf.resize(to_unsigned(handler.size));
  } else {
    if (precision > 17) return snprintf_float(value, precision, specs, buf);
    fp normalized = normalize(fp(value));
    const auto cached_pow = get_cached_power(
        min_exp - (normalized.e + fp::significand_size), cached_exp10);
    normalized = normalized * cached_pow;
    fixed_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
    if (grisu_gen_digits(normalized, 1, exp, handler) == digits::error)
      return snprintf_float(value, precision, specs, buf);
    int num_digits = handler.size;
    if (!fixed) {
      // Remove trailing zeros.
      while (num_digits > 0 && buf[num_digits - 1] == '0') {
        --num_digits;
        ++exp;
      }
    }
    buf.resize(to_unsigned(num_digits));
  }
  return exp - cached_exp10;
}